

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMPSIO.cpp
# Opt level: O2

int writeMPS(char *filename,int *numRow,int *numCol,int *objSense,double *objOffset,
            vector<int,_std::allocator<int>_> *Astart,vector<int,_std::allocator<int>_> *Aindex,
            vector<double,_std::allocator<double>_> *Avalue,
            vector<double,_std::allocator<double>_> *colCost,
            vector<double,_std::allocator<double>_> *colLower,
            vector<double,_std::allocator<double>_> *colUpper,
            vector<double,_std::allocator<double>_> *rowLower,
            vector<double,_std::allocator<double>_> *rowUpper,
            vector<int,_std::allocator<int>_> *integerColumn)

{
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer pdVar4;
  pointer pdVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  FILE *__s;
  pointer piVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  char *pcVar17;
  long lVar18;
  ulong uVar19;
  double v;
  uint local_c4;
  vector<double,_std::allocator<double>_> ranges;
  vector<double,_std::allocator<double>_> rhs;
  value_type_conflict1 local_50;
  vector<int,_std::allocator<int>_> r_ty;
  
  printf("writeMPS: Trying to open file %s\n",filename);
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    puts("writeMPS: Not opened file OK");
    iVar8 = 1;
  }
  else {
    puts("writeMPS: Opened file  OK");
    r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize(&r_ty,(long)*numRow);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&rhs,(long)*numRow,&local_50);
    local_50 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&ranges,(long)*numRow,&local_50);
    pdVar4 = (rowLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (rowUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar18 = 0;
    while( true ) {
      uVar3 = *numRow;
      lVar13 = (long)(int)uVar3;
      if (lVar13 <= lVar18) break;
      dVar1 = pdVar4[lVar18];
      dVar2 = pdVar5[lVar18];
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        if (1e+200 <= dVar2) {
          if (-1e+200 < dVar1) {
            r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar18] = 3;
            goto LAB_00152637;
          }
          r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = 0;
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = 0.0;
        }
        else {
          r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = 2;
          rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar18] = dVar2;
          dVar1 = pdVar4[lVar18];
          if (-1e+200 < dVar1) {
            ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar18] = pdVar5[lVar18] - dVar1;
          }
        }
      }
      else {
        r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
        [lVar18] = 1;
LAB_00152637:
        rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar18] = dVar1;
      }
      lVar18 = lVar18 + 1;
    }
    uVar10 = 0;
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar10 = (ulong)uVar3;
    }
    while (uVar14 = uVar16, uVar10 != uVar14) {
      if ((rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar14] != 0.0) ||
         (uVar16 = uVar14 + 1,
         NAN(rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar14]))) break;
    }
    uVar16 = 0;
    while (uVar15 = uVar16, uVar10 != uVar15) {
      if ((ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar15] != 0.0) ||
         (uVar16 = uVar15 + 1,
         NAN(ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar15]))) break;
    }
    uVar3 = *numCol;
    uVar16 = 0;
    if (0 < (int)uVar3) {
      uVar16 = (ulong)uVar3;
    }
    pcVar12 = "False";
    uVar10 = 0;
    do {
      uVar19 = uVar10;
      if (uVar16 == uVar19) {
        pcVar11 = "False";
        goto LAB_00152782;
      }
      dVar1 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar19];
    } while (((dVar1 == 0.0) && (!NAN(dVar1))) &&
            (uVar10 = uVar19 + 1,
            1e+200 <= (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar19]));
    pcVar11 = "True";
LAB_00152782:
    pcVar17 = "False";
    if ((long)uVar14 < lVar13) {
      pcVar17 = "True";
    }
    if ((long)uVar15 < lVar13) {
      pcVar12 = "True";
    }
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",pcVar17,pcVar12,pcVar11
          );
    fwrite("NAME\n",5,1,__s);
    fwrite("ROWS\n",5,1,__s);
    fwrite(" N  COST\n",9,1,__s);
    uVar16 = 0;
    while ((long)uVar16 < (long)*numRow) {
      pcVar12 = " N  R%-7d\n";
      if (r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar16] - 1U < 3) {
        pcVar12 = &DAT_00158d5c +
                  *(int *)(&DAT_00158d5c +
                          (ulong)(r_ty.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[uVar16] - 1U) * 4);
      }
      uVar16 = uVar16 + 1;
      fprintf(__s,pcVar12,uVar16 & 0xffffffff);
    }
    fwrite("COLUMNS\n",8,1,__s);
    bVar7 = false;
    local_c4 = 0;
    uVar16 = 0;
    while ((long)uVar16 < (long)*numCol) {
      if ((integerColumn->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar16] == 0) {
        if (bVar7) {
          pcVar12 = "    MARK%04d  \'MARKER\'                 \'INTEND\'\n";
          bVar6 = false;
          goto LAB_001528b2;
        }
      }
      else {
        pcVar12 = "    MARK%04d  \'MARKER\'                 \'INTORG\'\n";
        bVar6 = true;
        if (!bVar7) {
LAB_001528b2:
          bVar7 = bVar6;
          fprintf(__s,pcVar12,(ulong)local_c4);
          local_c4 = local_c4 + 1;
        }
      }
      dVar1 = (colCost->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar16];
      uVar10 = uVar16 + 1;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        fprintf(__s,"    C%-7d  COST      %12g\n",uVar10 & 0xffffffff);
      }
      piVar9 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      for (lVar18 = (long)piVar9[uVar16]; uVar16 = uVar10, lVar18 < piVar9[uVar10];
          lVar18 = lVar18 + 1) {
        fprintf(__s,"    C%-7d  R%-7d  %12g\n",
                (Avalue->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[lVar18],uVar10 & 0xffffffff,
                (ulong)((Aindex->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar18] + 1));
        piVar9 = (Astart->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
    }
    fwrite("RHS\n",4,1,__s);
    uVar16 = 0;
    while ((long)uVar16 < (long)*numRow) {
      pdVar4 = rhs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar16;
      uVar16 = uVar16 + 1;
      fprintf(__s,"    RHS_V     R%-7d  %12g\n",*pdVar4,uVar16 & 0xffffffff);
    }
    if ((long)uVar15 < lVar13) {
      fwrite("RANGES\n",7,1,__s);
      for (lVar18 = 0; lVar18 < *numRow; lVar18 = lVar18 + 1) {
        if ((ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[lVar18] != 0.0) ||
           (NAN(ranges.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar18]))) {
          fprintf(__s,"    RANGE     R%-7d  %12g\n",(ulong)((int)lVar18 + 1));
        }
      }
    }
    if ((long)uVar19 < (long)(int)uVar3) {
      fwrite("BOUNDS\n",7,1,__s);
      uVar16 = 0;
      while (uVar10 = uVar16, (long)uVar10 < (long)*numCol) {
        dVar1 = (colLower->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        dVar2 = (colUpper->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar10];
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          if (dVar2 < 1e+200) {
            fprintf(__s," UP BOUND     C%-7d  %12g\n",(ulong)((int)uVar10 + 1));
          }
          uVar16 = uVar10 + 1;
          if (dVar1 <= -1e+200) {
            fprintf(__s," MI BOUND     C%-7d\n",uVar16 & 0xffffffff);
          }
          else if ((dVar1 != 0.0) || (NAN(dVar1))) {
            pcVar12 = " LO BOUND     C%-7d  %12g\n";
            goto LAB_00152a84;
          }
        }
        else {
          pcVar12 = " FX BOUND     C%-7d  %12g\n";
LAB_00152a84:
          fprintf(__s,pcVar12,dVar1,uVar10 + 1 & 0xffffffff);
          uVar16 = uVar10 + 1;
        }
      }
    }
    fwrite("ENDATA\n",7,1,__s);
    fclose(__s);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ranges.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&rhs.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&r_ty.super__Vector_base<int,_std::allocator<int>_>);
    iVar8 = 0;
  }
  return iVar8;
}

Assistant:

int writeMPS(const char *filename, int& numRow, int& numCol, int& objSense, double& objOffset,
	     vector<int>& Astart, vector<int>& Aindex, vector<double>& Avalue,
	     vector<double>& colCost, vector<double>& colLower, vector<double>& colUpper,
	     vector<double>& rowLower, vector<double>& rowUpper,
	     vector<int>& integerColumn) {

#ifdef JAJH_dev
    printf("writeMPS: Trying to open file %s\n", filename);
#endif
    FILE *file = fopen(filename, "w");
    if (file == 0) {
#ifdef JAJH_dev
      printf("writeMPS: Not opened file OK\n");
#endif
      return 1;
    }
#ifdef JAJH_dev
    printf("writeMPS: Opened file  OK\n");
#endif
    vector<int> r_ty;
    vector<double> rhs, ranges;
    bool have_rhs = false;
    bool have_ranges = false;
    bool have_bounds = false;
    r_ty.resize(numRow);
    rhs.assign(numRow, 0);
    ranges.assign(numRow, 0);
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rowLower[r_n] == rowUpper[r_n]) {
	//Equality constraint - Type E - range = 0
	r_ty[r_n] = MPS_ROW_TY_E;
	rhs[r_n] = rowLower[r_n];
      } else if (!hsol_isInfinity(rowUpper[r_n])) {
	//Upper bounded constraint - Type L
	r_ty[r_n] = MPS_ROW_TY_L;
	rhs[r_n] = rowUpper[r_n];
	if (!hsol_isInfinity(-rowLower[r_n])) {
	  //Boxed constraint - range = u-l
	  ranges[r_n] = rowUpper[r_n]-rowLower[r_n];
	}
      } else if (!hsol_isInfinity(-rowLower[r_n])) {
	//Lower bounded constraint - Type G
	r_ty[r_n] = MPS_ROW_TY_G;
	rhs[r_n] = rowLower[r_n];
      } else {
	//Free constraint - Type N
	r_ty[r_n] = MPS_ROW_TY_N;
	rhs[r_n] = 0;
      }
    }
    
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (rhs[r_n]) {
	have_rhs = true;
	break;
      }
    }
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (ranges[r_n]) {
	have_ranges = true;
	break;
      }
    }
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (colLower[c_n]) {
	have_bounds = true;
	break;
      }
      if (!hsol_isInfinity(colUpper[c_n])) {
	have_bounds = true;
	break;
      }
    }
    printf("Model: RHS =     %s\n       RANGES =  %s\n       BOUNDS =  %s\n",
	   BoolToString(have_rhs), BoolToString(have_ranges), BoolToString(have_bounds));
    
    //Field:    1           2          3         4         5         6
    //Columns:  2-3        5-12      15-22     25-36     40-47     50-61
    //         1         2         3         4         5         6
    //1234567890123456789012345678901234567890123456789012345678901
    //x11x22222222xx33333333xx444444444444xxx55555555xx666666666666
    fprintf(file, "NAME\n");
    fprintf(file, "ROWS\n");
    fprintf(file, " N  COST\n");	
    for (int r_n = 0; r_n < numRow; r_n++) {
      if (r_ty[r_n] == MPS_ROW_TY_E) {
	fprintf(file, " E  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_G) {
	fprintf(file, " G  R%-7d\n", r_n+1);	
      } else if (r_ty[r_n] == MPS_ROW_TY_L) {
	fprintf(file, " L  R%-7d\n", r_n+1);	
      } else {
	fprintf(file, " N  R%-7d\n", r_n+1);	
      }
    }
    bool integerFg = false;
    int nIntegerMk = 0;
    fprintf(file, "COLUMNS\n");
    for (int c_n = 0; c_n < numCol; c_n++) {
      if (integerColumn[c_n] && !integerFg) {
	//Start an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTORG'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = true;
      } else if (!integerColumn[c_n] && integerFg) {
	//End an integer section
	fprintf(file, "    MARK%04d  'MARKER'                 'INTEND'\n", nIntegerMk);
	nIntegerMk++;
	integerFg = false;
      }
      if (colCost[c_n] != 0) {
	double v = colCost[c_n];
	fprintf(file, "    C%-7d  COST      %12g\n", c_n+1, v);	
      }
      for (int el_n = Astart[c_n]; el_n<Astart[c_n+1]; el_n++) {
	double v = Avalue[el_n];
	int r_n = Aindex[el_n];
	fprintf(file, "    C%-7d  R%-7d  %12g\n", c_n+1, r_n+1, v);	
      }
    }
    have_rhs = true;
    if (have_rhs) {
      fprintf(file, "RHS\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = rhs[r_n];
	//	if (v !=0)
	  fprintf(file, "    RHS_V     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_ranges) {
      fprintf(file, "RANGES\n");
      for (int r_n = 0; r_n < numRow; r_n++) {
	double v = ranges[r_n];
	if (v !=0) fprintf(file, "    RANGE     R%-7d  %12g\n", r_n+1, v);
      }
    }
    if (have_bounds) {
      fprintf(file, "BOUNDS\n");
      for (int c_n = 0; c_n < numCol; c_n++) {
	double lb = colLower[c_n];
	double ub = colUpper[c_n];
	if (lb == ub) {
	  fprintf(file, " FX BOUND     C%-7d  %12g\n", c_n+1, lb);
	} else {
	  if (!hsol_isInfinity(ub)) {
	    //Upper bounded variable
	    fprintf(file, " UP BOUND     C%-7d  %12g\n", c_n+1, ub);
	  }
	  if (!hsol_isInfinity(-lb)) {
	      //Lower bounded variable - default is 0
	      if (lb) {
		fprintf(file, " LO BOUND     C%-7d  %12g\n", c_n+1, lb);
	      }
	    } else {
	      //Infinite lower bound
	      fprintf(file, " MI BOUND     C%-7d\n", c_n+1);
	  }
	}
      }
    }
    fprintf(file, "ENDATA\n");
    fclose(file);
    return 0;
}